

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_log.cpp
# Opt level: O2

int mpp_get_log_level(void)

{
  RK_U32 local_c;
  
  mpp_env_get_u32("mpp_log_level",&local_c,mpp_log_level);
  mpp_log_level = 4;
  if (0xfffffff8 < local_c - 8) {
    mpp_log_level = local_c;
  }
  return mpp_log_level;
}

Assistant:

int mpp_get_log_level(void)
{
    int level;

    mpp_env_get_u32("mpp_log_level", (RK_U32 *)&level, mpp_log_level);

    if (level <= MPP_LOG_UNKNOWN || level > MPP_LOG_SILENT)
        level = MPP_LOG_INFO;

    mpp_log_level = level;

    return level;
}